

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

void __thiscall
duckdb::StrfTimeFormat::AddFormatSpecifier
          (StrfTimeFormat *this,string *preceding_literal,StrTimeSpecifier specifier)

{
  idx_t *piVar1;
  idx_t iVar2;
  StrTimeSpecifier local_41;
  string local_40;
  
  local_41 = specifier;
  ::std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)&this->is_date_specifier,
             (bool)((byte)(0xe1e000007 >> (specifier & (NANOSECOND_PADDED|LOCALE_APPROPRIATE_TIME)))
                   & specifier < (NANOSECOND_PADDED|DAY_OF_MONTH)));
  iVar2 = StrfTimepecifierSize(specifier);
  if (iVar2 == 0) {
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::push_back
              (&(this->var_length_specifiers).
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
               &local_41);
  }
  else {
    piVar1 = &(this->super_StrTimeFormat).constant_size;
    *piVar1 = *piVar1 + iVar2;
  }
  ::std::__cxx11::string::string((string *)&local_40,(string *)preceding_literal);
  StrTimeFormat::AddFormatSpecifier(&this->super_StrTimeFormat,&local_40,local_41);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void StrfTimeFormat::AddFormatSpecifier(string preceding_literal, StrTimeSpecifier specifier) {
	is_date_specifier.push_back(IsDateSpecifier(specifier));
	idx_t specifier_size = StrfTimepecifierSize(specifier);
	if (specifier_size == 0) {
		// variable length specifier
		var_length_specifiers.push_back(specifier);
	} else {
		// constant size specifier
		constant_size += specifier_size;
	}
	StrTimeFormat::AddFormatSpecifier(std::move(preceding_literal), specifier);
}